

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDup(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  int *piVar5;
  Gia_Obj_t *pGVar6;
  Abc_Cex_t *pAVar7;
  bool bVar8;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  iVar1 = Gia_ManHasChoices(p);
  if (iVar1 != 0) {
    iVar1 = Gia_ManObjNum(p);
    piVar5 = (int *)calloc((long)iVar1,4);
    p_00->pSibls = piVar5;
  }
  pGVar6 = Gia_ManConst0(p);
  pGVar6->Value = 0;
  local_24 = 1;
  while( true ) {
    bVar8 = false;
    if (local_24 < p->nObjs) {
      pGStack_20 = Gia_ManObj(p,local_24);
      bVar8 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    iVar1 = Gia_ObjIsBuf(pGStack_20);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAnd(pGStack_20);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsCi(pGStack_20);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsCo(pGStack_20);
          if (iVar1 != 0) {
            iVar1 = Gia_ObjFanin0Copy(pGStack_20);
            uVar2 = Gia_ManAppendCo(p_00,iVar1);
            pGStack_20->Value = uVar2;
          }
        }
        else {
          uVar2 = Gia_ManAppendCi(p_00);
          pGStack_20->Value = uVar2;
        }
      }
      else {
        iVar1 = Gia_ObjFanin0Copy(pGStack_20);
        iVar3 = Gia_ObjFanin1Copy(pGStack_20);
        uVar2 = Gia_ManAppendAnd(p_00,iVar1,iVar3);
        pGStack_20->Value = uVar2;
        iVar1 = Gia_ObjId(p,pGStack_20);
        iVar1 = Gia_ObjSibl(p,iVar1);
        if (iVar1 != 0) {
          iVar1 = Gia_ObjId(p,pGStack_20);
          pGVar6 = Gia_ObjSiblObj(p,iVar1);
          iVar1 = Abc_Lit2Var(pGVar6->Value);
          piVar5 = p_00->pSibls;
          iVar3 = Abc_Lit2Var(pGStack_20->Value);
          piVar5[iVar3] = iVar1;
        }
      }
    }
    else {
      iVar1 = Gia_ObjFanin0Copy(pGStack_20);
      uVar2 = Gia_ManAppendBuf(p_00,iVar1);
      pGStack_20->Value = uVar2;
    }
    local_24 = local_24 + 1;
  }
  iVar1 = Gia_ManRegNum(p);
  Gia_ManSetRegNum(p_00,iVar1);
  if (p->pCexSeq != (Abc_Cex_t *)0x0) {
    pAVar7 = p->pCexSeq;
    iVar1 = Gia_ManRegNum(p);
    pAVar7 = Abc_CexDup(pAVar7,iVar1);
    p_00->pCexSeq = pAVar7;
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDup( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    if ( Gia_ManHasChoices(p) )
        pNew->pSibls = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsAnd(pObj) )
        {
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
            if ( Gia_ObjSibl(p, Gia_ObjId(p, pObj)) )
                pNew->pSibls[Abc_Lit2Var(pObj->Value)] = Abc_Lit2Var(Gia_ObjSiblObj(p, Gia_ObjId(p, pObj))->Value);  
        }
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    if ( p->pCexSeq )
        pNew->pCexSeq = Abc_CexDup( p->pCexSeq, Gia_ManRegNum(p) );
    return pNew;
}